

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_18::FunctionInfoScanner::create(FunctionInfoScanner *this)

{
  FunctionInfoScanner *this_local;
  
  this_local = this;
  std::
  make_unique<wasm::(anonymous_namespace)::FunctionInfoScanner,std::unordered_map<wasm::Name,wasm::(anonymous_namespace)::FunctionInfo,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::(anonymous_namespace)::FunctionInfo>>>&>
            ((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
              *)&stack0xffffffffffffffe0);
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::(anonymous_namespace)::FunctionInfoScanner,std::default_delete<wasm::(anonymous_namespace)::FunctionInfoScanner>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,
             (unique_ptr<wasm::(anonymous_namespace)::FunctionInfoScanner,_std::default_delete<wasm::(anonymous_namespace)::FunctionInfoScanner>_>
              *)&stack0xffffffffffffffe0);
  std::
  unique_ptr<wasm::(anonymous_namespace)::FunctionInfoScanner,_std::default_delete<wasm::(anonymous_namespace)::FunctionInfoScanner>_>
  ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::FunctionInfoScanner,_std::default_delete<wasm::(anonymous_namespace)::FunctionInfoScanner>_>
                 *)&stack0xffffffffffffffe0);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<FunctionInfoScanner>(infos);
  }